

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize_expr.cpp
# Opt level: O2

bool anon_unknown.dwarf_4b66::test_optim_equiv_random
               (string *str,uint32_t var_id,double xmin,double xmax)

{
  uint uVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  result_type_conflict1 rVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Expr expr;
  string err;
  Expr orig;
  uniform_real_distribution<double> unif;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&err,"a",(allocator<char> *)&expr);
  nivalis::Environment::set((Environment *)&(anonymous_namespace)::env,&err,10.0);
  std::__cxx11::string::~string((string *)&err);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  nivalis::parse(&expr,str,(Environment *)&(anonymous_namespace)::env,false,true,0,&err);
  nivalis::util::trim((util *)&err,str);
  if (err._M_string_length == 0) {
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
              (&orig.ast,&expr.ast);
    nivalis::Expr::optimize(&expr,5);
    iVar3 = 0;
    iVar4 = 1000;
    unif._M_param._M_a = xmin;
    unif._M_param._M_b = xmax;
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      rVar6 = std::uniform_real_distribution<double>::operator()
                        (&unif,(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                *)&nivalis::test::(anonymous_namespace)::reng);
      *(result_type_conflict1 *)((anonymous_namespace)::env + (ulong)var_id * 8) = rVar6;
      dVar7 = nivalis::Expr::operator()(&expr,(Environment *)&(anonymous_namespace)::env);
      dVar8 = nivalis::Expr::operator()(&orig,(Environment *)&(anonymous_namespace)::env);
      if (NAN(dVar7)) {
        uVar1 = 1;
        if (!NAN(dVar8)) goto LAB_00109731;
      }
      else {
LAB_00109731:
        dVar9 = ABS(dVar7 - dVar8);
        dVar7 = ABS((dVar7 - dVar8) / dVar7);
        if (dVar9 <= dVar7) {
          dVar7 = dVar9;
        }
        uVar1 = (uint)(dVar7 < 1e-06);
      }
      iVar3 = iVar3 + uVar1;
    }
    bVar5 = iVar3 == 1000;
    if (!bVar5) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Optimization equiv test fail\nopti ");
      poVar2 = nivalis::operator<<(poVar2,&expr);
      poVar2 = std::operator<<(poVar2,"\norig ");
      poVar2 = nivalis::operator<<(poVar2,&orig);
      std::operator<<(poVar2,"\n");
    }
    std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                  &orig);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Provided expression failed to parse: ");
    poVar2 = std::operator<<(poVar2,(string *)&err);
    std::operator<<(poVar2,"\n");
    bVar5 = false;
  }
  std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~_Vector_base
            ((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)&expr)
  ;
  std::__cxx11::string::~string((string *)&err);
  return bVar5;
}

Assistant:

bool test_optim_equiv_random(const std::string& str,
            uint32_t var_id,
            double xmin = -100, double xmax = 100) {
        env.set("a", 10.);
        std::string err;
        Expr expr = parse(str, env, false, true, 0, &err);
        util::trim(err);
        if (err.size()) {
            std::cout << "Provided expression failed to parse: " << err << "\n";
            return false;
        }
        Expr orig = expr;
        expr.optimize();
        int cnt = 0;
        static const int N_ITER = 1000;
        std::uniform_real_distribution<double> unif(xmin, xmax);
        for (int i = 0; i < N_ITER; ++i) {
            double x = unif(test::reng);
            env.vars[var_id] = x;
            double fx = expr(env);
            double ofx = orig(env);
            if (std::isnan(fx) && std::isnan(ofx)) ++cnt;
            else cnt += (absrelerr(fx, ofx) < FLOAT_EPS);
        }
        if (cnt != N_ITER) {
            std::cerr << "Optimization equiv test fail\nopti " << expr <<
                "\norig " << orig << "\n";
            return false;
        }
        return true;
    }